

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Mtbdd __thiscall sylvan::Mtbdd::MtbddStrictThreshold(Mtbdd *this,double value)

{
  MTBDD from;
  MTBDD *in_RSI;
  double value_local;
  Mtbdd *this_local;
  
  from = mtbdd_strict_threshold_double_RUN(*in_RSI,value);
  Mtbdd(this,from);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::MtbddStrictThreshold(double value) const
{
    return mtbdd_strict_threshold_double(mtbdd, value);
}